

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::ensureGeometryUpdate(Text *this)

{
  ulong uVar1;
  bool bVar2;
  Texture *pTVar3;
  Glyph *pGVar4;
  size_t sVar5;
  float *pfVar6;
  int __x;
  Font *in_RDI;
  float fVar7;
  float extraout_XMM0_Da;
  float outline;
  float bottom;
  float right;
  float top;
  float left;
  undefined4 in_stack_00000060;
  float in_stack_00000064;
  Glyph *glyph;
  VertexArray *in_stack_00000070;
  Glyph *glyph_1;
  Vector2f in_stack_00000080;
  Uint32 curChar;
  size_t i;
  Uint32 prevChar;
  float maxY;
  float maxX;
  float minY;
  float minX;
  float y;
  float x;
  float lineSpacing;
  float letterSpacing;
  float whitespaceWidth;
  float strikeThroughOffset;
  FloatRect xBounds;
  float underlineThickness;
  float underlineOffset;
  float italicShear;
  bool isStrikeThrough;
  bool isUnderlined;
  bool isBold;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  Font *in_stack_ffffffffffffff10;
  Font *in_stack_ffffffffffffff18;
  float local_cc;
  Uint32 in_stack_ffffffffffffff40;
  Uint32 in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  Vector2<float> local_98;
  Glyph *local_90;
  Vector2<float> local_88;
  Glyph *local_80;
  Uint32 local_74;
  ulong local_70;
  Uint32 local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float local_24;
  float local_20;
  byte local_1b;
  byte local_1a;
  byte local_19;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  Font *this_00;
  
  if ((in_RDI[1].m_info.family.field_2._M_allocated_capacity != 0) &&
     ((this_00 = in_RDI, ((byte)in_RDI[2].m_info.family._M_dataplus & 1) != 0 ||
      (pTVar3 = Font::getTexture(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c),
      pTVar3->m_cacheId != in_RDI[2].m_info.family._M_string_length)))) {
    pTVar3 = Font::getTexture(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    in_RDI[2].m_info.family._M_string_length = pTVar3->m_cacheId;
    in_RDI[2].m_info.family._M_dataplus = (_Alloc_hider)0x0;
    VertexArray::clear((VertexArray *)0x21ed71);
    VertexArray::clear((VertexArray *)0x21ed82);
    Rect<float>::Rect((Rect<float> *)&stack0xffffffffffffffe8);
    in_RDI[2].m_refCount = (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    *(ulong *)&in_RDI[2].m_isSmooth = CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
    bVar2 = String::isEmpty((String *)0x21edbe);
    if (!bVar2) {
      local_19 = in_RDI[1].m_pages._M_t._M_impl.field_0x4 & 1;
      local_1a = (byte)((*(uint *)&in_RDI[1].m_pages._M_t._M_impl.field_0x4 & 4) >> 2);
      local_1b = (byte)((*(uint *)&in_RDI[1].m_pages._M_t._M_impl.field_0x4 & 8) >> 3);
      local_cc = 0.209;
      if ((*(uint *)&in_RDI[1].m_pages._M_t._M_impl.field_0x4 & 2) == 0) {
        local_cc = 0.0;
      }
      local_20 = local_cc;
      local_24 = Font::getUnderlinePosition
                           (in_stack_ffffffffffffff18,
                            (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      local_28 = Font::getUnderlineThickness
                           (in_stack_ffffffffffffff18,
                            (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      pGVar4 = Font::getGlyph(this_00,(Uint32)in_stack_fffffffffffffff4,
                              (uint)in_stack_fffffffffffffff0,
                              SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0),
                              in_stack_ffffffffffffffe8);
      local_38._0_4_ = (pGVar4->bounds).left;
      local_38._4_4_ = (pGVar4->bounds).top;
      uStack_30._0_4_ = (pGVar4->bounds).width;
      uStack_30._4_4_ = (pGVar4->bounds).height;
      local_3c = (float)local_38._4_4_ + (float)uStack_30._4_4_ * 0.5;
      pGVar4 = Font::getGlyph(this_00,(Uint32)in_stack_fffffffffffffff4,
                              (uint)in_stack_fffffffffffffff0,
                              SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0),
                              in_stack_ffffffffffffffe8);
      local_44 = (pGVar4->advance / 3.0) *
                 (*(float *)((long)&in_RDI[1].m_info.family.field_2 + 0xc) + -1.0);
      local_40 = pGVar4->advance + local_44;
      local_48 = Font::getLineSpacing
                           (in_stack_ffffffffffffff18,
                            (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      local_48 = local_48 * *(float *)&in_RDI[1].m_pages._M_t._M_impl;
      local_4c = 0.0;
      local_50 = (float)*(uint *)((long)&in_RDI[1].m_info.family.field_2 + 8);
      local_54 = (float)*(uint *)((long)&in_RDI[1].m_info.family.field_2 + 8);
      local_58 = (float)*(uint *)((long)&in_RDI[1].m_info.family.field_2 + 8);
      local_5c = 0.0;
      local_60 = 0.0;
      local_64 = 0;
      local_70 = 0;
      while( true ) {
        uVar1 = local_70;
        __x = (int)in_RDI + 0xb8;
        sVar5 = String::getSize((String *)0x21f041);
        if (sVar5 <= uVar1) break;
        local_74 = String::operator[]((String *)in_stack_ffffffffffffff10,
                                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        if (local_74 != 0xd) {
          fVar7 = Font::getKerning((Font *)CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48),
                                   in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                                   (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
          local_4c = fVar7 + local_4c;
          if ((((local_1a & 1) != 0) && (local_74 == 10)) && (local_64 != 10)) {
            anon_unknown.dwarf_1cf47f::addLine
                      (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                       (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
            fVar7 = *(float *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_parent;
            if ((fVar7 != 0.0) || (NAN(fVar7))) {
              anon_unknown.dwarf_1cf47f::addLine
                        (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                         (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
            }
          }
          if ((((local_1b & 1) != 0) && (local_74 == 10)) && (local_64 != 10)) {
            anon_unknown.dwarf_1cf47f::addLine
                      (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                       (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
            fVar7 = *(float *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_parent;
            if ((fVar7 != 0.0) || (NAN(fVar7))) {
              anon_unknown.dwarf_1cf47f::addLine
                        (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                         (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
            }
          }
          local_64 = local_74;
          if (((local_74 == 0x20) || (local_74 == 10)) || (local_74 == 9)) {
            pfVar6 = std::min<float>(&local_54,&local_4c);
            local_54 = *pfVar6;
            pfVar6 = std::min<float>(&local_58,&local_50);
            local_58 = *pfVar6;
            if (local_74 == 9) {
              local_4c = local_40 * 4.0 + local_4c;
            }
            else if (local_74 == 10) {
              local_50 = local_48 + local_50;
              local_4c = 0.0;
            }
            else if (local_74 == 0x20) {
              local_4c = local_40 + local_4c;
            }
            pfVar6 = std::max<float>(&local_5c,&local_4c);
            local_5c = *pfVar6;
            pfVar6 = std::max<float>(&local_60,&local_50);
            local_60 = *pfVar6;
          }
          else {
            fVar7 = *(float *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_parent;
            if ((fVar7 != 0.0) || (NAN(fVar7))) {
              local_80 = Font::getGlyph(this_00,(Uint32)in_stack_fffffffffffffff4,
                                        (uint)in_stack_fffffffffffffff0,
                                        SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0),
                                        in_stack_ffffffffffffffe8);
              Vector2<float>::Vector2(&local_88,local_4c,local_50);
              anon_unknown.dwarf_1cf47f::addGlyphQuad
                        ((VertexArray *)glyph_1,in_stack_00000080,(Color *)in_stack_00000070,
                         (Glyph *)CONCAT44(glyph._4_4_,glyph._0_4_),in_stack_00000064);
            }
            local_90 = Font::getGlyph(this_00,(Uint32)in_stack_fffffffffffffff4,
                                      (uint)in_stack_fffffffffffffff0,
                                      SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0),
                                      in_stack_ffffffffffffffe8);
            in_stack_ffffffffffffff10 =
                 (Font *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            Vector2<float>::Vector2(&local_98,local_4c,local_50);
            anon_unknown.dwarf_1cf47f::addGlyphQuad
                      ((VertexArray *)glyph_1,in_stack_00000080,(Color *)in_stack_00000070,
                       (Glyph *)CONCAT44(glyph._4_4_,glyph._0_4_),in_stack_00000064);
            local_9c = (local_90->bounds).left;
            local_a0 = (local_90->bounds).top;
            local_a4 = (local_90->bounds).left + (local_90->bounds).width;
            local_a8 = (local_90->bounds).top + (local_90->bounds).height;
            local_ac = -local_20 * local_a8 + local_4c + local_9c;
            pfVar6 = std::min<float>(&local_54,&local_ac);
            local_54 = *pfVar6;
            local_b0 = -local_20 * local_a0 + local_4c + local_a4;
            pfVar6 = std::max<float>(&local_5c,&local_b0);
            local_5c = *pfVar6;
            in_stack_ffffffffffffff4c = local_50 + local_a0;
            pfVar6 = std::min<float>(&local_58,(float *)&stack0xffffffffffffff4c);
            local_58 = *pfVar6;
            in_stack_ffffffffffffff48 = local_50 + local_a8;
            pfVar6 = std::max<float>(&local_60,(float *)&stack0xffffffffffffff48);
            local_60 = *pfVar6;
            local_4c = local_90->advance + local_44 + local_4c;
          }
        }
        local_70 = local_70 + 1;
      }
      fVar7 = *(float *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        std::ceil((double)(ulong)*(uint *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header.
                                           _M_header._M_parent);
        std::abs(__x);
        local_54 = local_54 - extraout_XMM0_Da;
        local_5c = extraout_XMM0_Da + local_5c;
        local_58 = local_58 - extraout_XMM0_Da;
        local_60 = extraout_XMM0_Da + local_60;
      }
      if (((local_1a & 1) != 0) && (0.0 < local_4c)) {
        anon_unknown.dwarf_1cf47f::addLine
                  (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                   (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
        fVar7 = *(float *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if ((fVar7 != 0.0) || (NAN(fVar7))) {
          anon_unknown.dwarf_1cf47f::addLine
                    (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                     (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
        }
      }
      if (((local_1b & 1) != 0) && (0.0 < local_4c)) {
        anon_unknown.dwarf_1cf47f::addLine
                  (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                   (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
        fVar7 = *(float *)&in_RDI[1].m_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if ((fVar7 != 0.0) || (NAN(fVar7))) {
          anon_unknown.dwarf_1cf47f::addLine
                    (in_stack_00000070,glyph._4_4_,glyph._0_4_,
                     (Color *)CONCAT44(in_stack_00000064,in_stack_00000060),left,top,right);
        }
      }
      *(float *)&in_RDI[2].m_refCount = local_54;
      *(float *)((long)&in_RDI[2].m_refCount + 4) = local_58;
      *(float *)&in_RDI[2].m_isSmooth = local_5c - local_54;
      *(float *)&in_RDI[2].field_0x2c = local_60 - local_58;
    }
  }
  return;
}

Assistant:

void Text::ensureGeometryUpdate() const
{
    if (!m_font)
        return;

    // Do nothing, if geometry has not changed and the font texture has not changed
    if (!m_geometryNeedUpdate && m_font->getTexture(m_characterSize).m_cacheId == m_fontTextureId)
        return;

    // Save the current fonts texture id
    m_fontTextureId = m_font->getTexture(m_characterSize).m_cacheId;

    // Mark geometry as updated
    m_geometryNeedUpdate = false;

    // Clear the previous geometry
    m_vertices.clear();
    m_outlineVertices.clear();
    m_bounds = FloatRect();

    // No text: nothing to draw
    if (m_string.isEmpty())
        return;

    // Compute values related to the text style
    bool  isBold             = m_style & Bold;
    bool  isUnderlined       = m_style & Underlined;
    bool  isStrikeThrough    = m_style & StrikeThrough;
    float italicShear        = (m_style & Italic) ? 0.209f : 0.f; // 12 degrees in radians
    float underlineOffset    = m_font->getUnderlinePosition(m_characterSize);
    float underlineThickness = m_font->getUnderlineThickness(m_characterSize);

    // Compute the location of the strike through dynamically
    // We use the center point of the lowercase 'x' glyph as the reference
    // We reuse the underline thickness as the thickness of the strike through as well
    FloatRect xBounds = m_font->getGlyph(L'x', m_characterSize, isBold).bounds;
    float strikeThroughOffset = xBounds.top + xBounds.height / 2.f;

    // Precompute the variables needed by the algorithm
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;
    float x               = 0.f;
    float y               = static_cast<float>(m_characterSize);

    // Create one quad for each character
    float minX = static_cast<float>(m_characterSize);
    float minY = static_cast<float>(m_characterSize);
    float maxX = 0.f;
    float maxY = 0.f;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < m_string.getSize(); ++i)
    {
        Uint32 curChar = m_string[i];

        // Skip the \r char to avoid weird graphical issues
        if (curChar == L'\r')
            continue;

        // Apply the kerning offset
        x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);

        // If we're using the underlined style and there's a new line, draw a line
        if (isUnderlined && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
        }

        // If we're using the strike through style and there's a new line, draw a line across all characters
        if (isStrikeThrough && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
        }

        prevChar = curChar;

        // Handle special characters
        if ((curChar == L' ') || (curChar == L'\n') || (curChar == L'\t'))
        {
            // Update the current bounds (min coordinates)
            minX = std::min(minX, x);
            minY = std::min(minY, y);

            switch (curChar)
            {
                case L' ':  x += whitespaceWidth;     break;
                case L'\t': x += whitespaceWidth * 4; break;
                case L'\n': y += lineSpacing; x = 0;  break;
            }

            // Update the current bounds (max coordinates)
            maxX = std::max(maxX, x);
            maxY = std::max(maxY, y);

            // Next glyph, no need to create a quad for whitespace
            continue;
        }

        // Apply the outline
        if (m_outlineThickness != 0)
        {
            const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold, m_outlineThickness);

            // Add the outline glyph to the vertices
            addGlyphQuad(m_outlineVertices, Vector2f(x, y), m_outlineColor, glyph, italicShear);
        }

        // Extract the current glyph's description
        const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold);

        // Add the glyph to the vertices
        addGlyphQuad(m_vertices, Vector2f(x, y), m_fillColor, glyph, italicShear);

        // Update the current bounds
        float left   = glyph.bounds.left;
        float top    = glyph.bounds.top;
        float right  = glyph.bounds.left + glyph.bounds.width;
        float bottom = glyph.bounds.top + glyph.bounds.height;

        minX = std::min(minX, x + left - italicShear * bottom);
        maxX = std::max(maxX, x + right - italicShear * top);
        minY = std::min(minY, y + top);
        maxY = std::max(maxY, y + bottom);

        // Advance to the next character
        x += glyph.advance + letterSpacing;
    }

    // If we're using outline, update the current bounds
    if (m_outlineThickness != 0)
    {
        float outline = std::abs(std::ceil(m_outlineThickness));
        minX -= outline;
        maxX += outline;
        minY -= outline;
        maxY += outline;
    }

    // If we're using the underlined style, add the last line
    if (isUnderlined && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
    }

    // If we're using the strike through style, add the last line across all characters
    if (isStrikeThrough && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
    }

    // Update the bounding rectangle
    m_bounds.left = minX;
    m_bounds.top = minY;
    m_bounds.width = maxX - minX;
    m_bounds.height = maxY - minY;
}